

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono_time_traits.hpp
# Opt level: O2

time_type asio::detail::
          chrono_time_traits<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>_>
          ::add(time_type *t,duration_type *d)

{
  ulong uVar1;
  long lVar2;
  
  uVar1 = (t->__d).__r;
  if ((long)uVar1 < 0) {
    lVar2 = d->__r;
    if (SBORROW8(lVar2,-(uVar1 & 0x7fffffffffffffff)) !=
        (long)(lVar2 + (uVar1 & 0x7fffffffffffffff)) < 0) {
      return (time_type)-0x8000000000000000;
    }
  }
  else {
    lVar2 = d->__r;
    if ((long)(0x7fffffffffffffff - uVar1) < lVar2) {
      return (time_type)0x7fffffffffffffff;
    }
  }
  return (time_type)(duration)(lVar2 + uVar1);
}

Assistant:

static time_type add(const time_type& t, const duration_type& d)
  {
    const time_type epoch;
    if (t >= epoch)
    {
      if ((time_type::max)() - t < d)
        return (time_type::max)();
    }
    else // t < epoch
    {
      if (-(t - (time_type::min)()) > d)
        return (time_type::min)();
    }

    return t + d;
  }